

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O2

void pnga_bin_sorter(Integer g_bin,Integer g_cnt,Integer g_off)

{
  Integer proc;
  logical lVar1;
  void *buf;
  long lVar2;
  int num;
  Integer hi;
  Integer lo;
  Integer *ptr;
  Integer nbin;
  Integer g_range;
  Integer totbin;
  Integer bin_range [2];
  Integer crap;
  Integer ndim;
  Integer type;
  Integer rhi [2];
  Integer rlo [2];
  long local_a8;
  long local_a0;
  Integer *local_98;
  long local_90;
  Integer local_88;
  long local_80;
  long local_78;
  long local_70 [2];
  Integer local_60;
  long local_58;
  Integer local_50 [2];
  long local_40;
  Integer local_38;
  long local_30;
  
  proc = pnga_nodeid();
  lVar1 = pnga_create_bin_range(g_bin,g_cnt,g_off,&local_88);
  if (lVar1 == 0) {
    pnga_error("ga_bin_sorter: failed to create temp bin range array",0);
  }
  pnga_inquire(g_bin,local_50,&local_58,&local_80);
  if (local_58 != 1) {
    pnga_error("ga_bin_sorter: 1-dim array required",local_58);
  }
  pnga_distribution(g_bin,proc,&local_a0,&local_a8);
  if (0 < local_a0) {
    local_38 = 1;
    local_40 = proc + 1;
    local_50[1] = 2;
    local_30 = local_40;
    pnga_get(local_88,&local_38,local_50 + 1,&local_78,local_50 + 1);
    local_70[0] = local_70[0] - local_78;
    lVar2 = local_70[0] + 1;
    local_90 = lVar2;
    if (((local_70[0] < 0) || (local_80 <= local_70[0])) || (local_a8 - local_a0 < local_70[0])) {
      pnga_error("ga_bin_sorter:bad nbin",lVar2);
    }
    buf = malloc(lVar2 * 8);
    if (buf == (void *)0x0) {
      pnga_error("ga_bin_sorter:memory allocation failed",lVar2);
    }
    pnga_get(g_cnt,&local_78,local_70,buf,&local_90);
    pnga_access_ptr(g_bin,&local_a0,&local_a8,&local_98,&local_60);
    for (lVar2 = 0; lVar2 < local_90; lVar2 = lVar2 + 1) {
      num = (int)*(undefined8 *)((long)buf + lVar2 * 8);
      gai_hsort(local_98,num);
      local_98 = local_98 + num;
    }
    pnga_release_update(g_bin,&local_a0,&local_a8);
  }
  pnga_sync();
  return;
}

Assistant:

void pnga_bin_sorter(Integer g_bin, Integer g_cnt, Integer g_off)
{
Integer nbin,totbin,type,ndim,lo,hi,me=pnga_nodeid(),crap;
Integer g_range;

    if(FALSE==pnga_create_bin_range(g_bin, g_cnt, g_off, &g_range))
        pnga_error("ga_bin_sorter: failed to create temp bin range array",0); 

    pnga_inquire(g_bin, &type, &ndim, &totbin);
    if(ndim !=1) pnga_error("ga_bin_sorter: 1-dim array required",ndim);
     
    pnga_distribution(g_bin, me, &lo, &hi);
    if (lo > 0 ){ /* we get 0 if no elements stored on this process */
        Integer bin_range[2], rlo[2],rhi[2];
        Integer *bin_cnt, *ptr, i;

        /* get and inspect range of bins stored on current processor */
        rlo[0] = 1; rlo[1]= me+1; rhi[0]=2; rhi[1]=rlo[1];
        pnga_get(g_range, rlo, rhi, bin_range, rhi); /* local */
        nbin = bin_range[1]-bin_range[0]+1;
        if(nbin<1 || nbin> totbin || nbin>(hi-lo+1))
           pnga_error("ga_bin_sorter:bad nbin",nbin);

        /* get count of elements in each bin stored on this task */
        if(!(bin_cnt = (Integer*)malloc(nbin*sizeof(Integer))))
           pnga_error("ga_bin_sorter:memory allocation failed",nbin);
        pnga_get(g_cnt,bin_range,bin_range+1,bin_cnt,&nbin);

        /* get access to local bin elements */
        pnga_access_ptr(g_bin, &lo, &hi, &ptr, &crap);
        
        for(i=0;i<nbin;i++){ 
            int elems =(int) bin_cnt[i];
            gai_hsort(ptr, elems);
            ptr+=elems;
        }
        pnga_release_update(g_bin, &lo, &hi);             
    }

    pnga_sync();
}